

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void Cmd_cachesound(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *name;
  sfxinfo_t *sfx;
  FSoundID local_28;
  FSoundID local_24;
  int local_20;
  FSoundID sfxnum;
  int i;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  sfxnum.ID = key;
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    Printf("Usage: cachesound <sound> ...\n");
  }
  else {
    for (local_20 = 1; iVar2 = local_20, iVar3 = FCommandLine::argc(argv), iVar2 < iVar3;
        local_20 = local_20 + 1) {
      name = FCommandLine::operator[](argv,local_20);
      FSoundID::FSoundID(&local_24,name);
      FSoundID::FSoundID(&local_28,0);
      bVar1 = FSoundID::operator!=(&local_24,&local_28);
      if (bVar1) {
        iVar2 = FSoundID::operator_cast_to_int(&local_24);
        sfx = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(long)iVar2);
        S_CacheSound(sfx);
      }
    }
  }
  return;
}

Assistant:

CCMD (cachesound)
{
	if (argv.argc() < 2)
	{
		Printf ("Usage: cachesound <sound> ...\n");
		return;
	}
	for (int i = 1; i < argv.argc(); ++i)
	{
		FSoundID sfxnum = argv[i];
		if (sfxnum != FSoundID(0))
		{
			S_CacheSound (&S_sfx[sfxnum]);
		}
	}
}